

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O1

void SerializeTransaction<ParamsStream<AutoFile&,TransactionSerParams>,CTransaction>
               (CTransaction *tx,ParamsStream<AutoFile_&,_TransactionSerParams> *s,
               TransactionSerParams *params)

{
  bool bVar1;
  VectorFormatter<DefaultFormatter> VVar2;
  size_t in_RCX;
  pointer pCVar3;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  vector<CTxIn,_std::allocator<CTxIn>_> vinDummy;
  vector<CTxIn,_std::allocator<CTxIn>_> local_58;
  VectorFormatter<DefaultFormatter> local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = params->allow_witness;
  local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,tx->version);
  AutoFile::write(s->m_substream,(int)&local_58,(void *)0x4,in_RCX);
  VVar2 = (VectorFormatter<DefaultFormatter>)0x0;
  if (bVar1 != false) {
    VVar2 = (VectorFormatter<DefaultFormatter>)tx->m_has_witness;
  }
  if (VVar2 != (VectorFormatter<DefaultFormatter>)0x0) {
    local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<AutoFile&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
              (&local_39,s,&local_58);
    local_39 = VVar2;
    AutoFile::write(s->m_substream,(int)&local_39,(void *)0x1,in_RCX);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_58);
  }
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<AutoFile&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
            ((VectorFormatter<DefaultFormatter> *)&local_58,s,&tx->vin);
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<AutoFile&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
            ((VectorFormatter<DefaultFormatter> *)&local_58,s,&tx->vout);
  if ((VVar2 != (VectorFormatter<DefaultFormatter>)0x0) &&
     (pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start,
     (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_finish != pCVar3)) {
    lVar4 = 0x50;
    uVar5 = 0;
    do {
      VectorFormatter<DefaultFormatter>::
      Ser<ParamsStream<AutoFile&,TransactionSerParams>,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                ((VectorFormatter<DefaultFormatter> *)&local_58,s,
                 (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)((pCVar3->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + lVar4)
                );
      uVar5 = uVar5 + 1;
      pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x68;
    } while (uVar5 < (ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_58.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,tx->nLockTime);
  AutoFile::write(s->m_substream,(int)&local_58,(void *)0x4,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeTransaction(const TxType& tx, Stream& s, const TransactionSerParams& params)
{
    const bool fAllowWitness = params.allow_witness;

    s << tx.version;
    unsigned char flags = 0;
    // Consistency check
    if (fAllowWitness) {
        /* Check whether witnesses need to be serialized. */
        if (tx.HasWitness()) {
            flags |= 1;
        }
    }
    if (flags) {
        /* Use extended format in case witnesses are to be serialized. */
        std::vector<CTxIn> vinDummy;
        s << vinDummy;
        s << flags;
    }
    s << tx.vin;
    s << tx.vout;
    if (flags & 1) {
        for (size_t i = 0; i < tx.vin.size(); i++) {
            s << tx.vin[i].scriptWitness.stack;
        }
    }
    s << tx.nLockTime;
}